

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Column.cpp
# Opt level: O0

string * __thiscall
SQLite::Column::getString_abi_cxx11_(string *__return_storage_ptr__,Column *this)

{
  int iVar1;
  element_type *peVar2;
  char *__s;
  allocator<char> local_21;
  char *local_20;
  char *data;
  Column *this_local;
  
  data = (char *)this;
  this_local = (Column *)__return_storage_ptr__;
  peVar2 = std::__shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2> *)this);
  sqlite3_column_bytes(peVar2,this->mIndex);
  peVar2 = std::__shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2> *)this);
  __s = (char *)sqlite3_column_blob(peVar2,this->mIndex);
  local_20 = __s;
  peVar2 = std::__shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2> *)this);
  iVar1 = sqlite3_column_bytes(peVar2,this->mIndex);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,__s,(long)iVar1,&local_21);
  std::allocator<char>::~allocator(&local_21);
  return __return_storage_ptr__;
}

Assistant:

std::string Column::getString() const
{
    // Note: using sqlite3_column_blob and not sqlite3_column_text
    // - no need for sqlite3_column_text to add a \0 on the end, as we're getting the bytes length directly
    //   however, we need to call sqlite3_column_bytes() to ensure correct format. It's a noop on a BLOB
    //   or a TEXT value with the correct encoding (UTF-8). Otherwise it'll do a conversion to TEXT (UTF-8).
    (void)sqlite3_column_bytes(mStmtPtr.get(), mIndex);
    auto data = static_cast<const char *>(sqlite3_column_blob(mStmtPtr.get(), mIndex));

    // SQLite docs: "The safest policy is to invoke… sqlite3_column_blob() followed by sqlite3_column_bytes()"
    // Note: std::string is ok to pass nullptr as first arg, if length is 0
    return std::string(data, sqlite3_column_bytes(mStmtPtr.get(), mIndex));
}